

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

RTQuaternion __thiscall RTQuaternion::conjugate(RTQuaternion *this)

{
  RTQuaternion *this_local;
  RTQuaternion q;
  
  RTQuaternion((RTQuaternion *)&this_local);
  setScalar((RTQuaternion *)&this_local,this->m_data[0]);
  setX((RTQuaternion *)&this_local,-this->m_data[1]);
  setY((RTQuaternion *)&this_local,-this->m_data[2]);
  setZ((RTQuaternion *)&this_local,-this->m_data[3]);
  return (RTQuaternion)_this_local;
}

Assistant:

RTQuaternion RTQuaternion::conjugate() const
{
    RTQuaternion q;
    q.setScalar(m_data[0]);
    q.setX(-m_data[1]);
    q.setY(-m_data[2]);
    q.setZ(-m_data[3]);
    return q;
}